

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O2

ModuleImpl * __thiscall
capnp::SchemaParser::getModuleImpl(SchemaParser *this,Own<capnp::SchemaFile> *file)

{
  unordered_map<const_capnp::SchemaFile_*,_kj::Own<capnp::SchemaParser::ModuleImpl>,_capnp::(anonymous_namespace)::SchemaFileHash,_capnp::(anonymous_namespace)::SchemaFileEq,_std::allocator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>_>
  *this_00;
  __node_base *p_Var1;
  size_type *psVar2;
  Impl *this_01;
  long *plVar3;
  _Hash_node_base *p_Var4;
  __node_base _Var5;
  ModuleImpl *pMVar6;
  bool bVar7;
  char cVar8;
  __node_ptr p_Var9;
  long lVar10;
  __node_base_ptr *pp_Var11;
  __node_base_ptr *pp_Var12;
  _Hash_node_base *p_Var13;
  ulong uVar14;
  size_t __bkt_count;
  ulong uVar15;
  _Hash_node_base *p_Var16;
  __node_base_ptr p_Var17;
  __node_base _Var18;
  __node_base_ptr p_Var19;
  __node_ptr p_Var20;
  undefined1 auVar21 [16];
  pair<capnp::SchemaFile_*,_kj::Own<capnp::SchemaParser::ModuleImpl>_> local_90;
  _Scoped_node local_78;
  size_t local_68;
  Own<capnp::SchemaFile> *local_60;
  SchemaParser *local_58;
  Locked<std::unordered_map<const_capnp::SchemaFile_*,_kj::Own<capnp::SchemaParser::ModuleImpl>,_capnp::(anonymous_namespace)::SchemaFileHash,_capnp::(anonymous_namespace)::SchemaFileEq,_std::allocator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>_>_>
  lock;
  Own<capnp::SchemaParser::ModuleImpl> local_40;
  
  this_01 = (this->impl).ptr;
  local_58 = this;
  kj::_::Mutex::lock((Mutex *)this_01,EXCLUSIVE);
  this_00 = &(this_01->fileMap).value;
  local_90.first = file->ptr;
  local_40.disposer = (Disposer *)0x0;
  local_40.ptr = (ModuleImpl *)0x0;
  local_90.second.disposer = (Disposer *)0x0;
  local_90.second.ptr = (ModuleImpl *)0x0;
  local_78._M_h = (__hashtable_alloc *)this_00;
  lock.mutex = (Mutex *)this_01;
  lock.ptr = this_00;
  p_Var9 = std::__detail::
           _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<capnp::SchemaFile_const*const,kj::Own<capnp::SchemaParser::ModuleImpl>>,true>>>
           ::
           _M_allocate_node<std::pair<capnp::SchemaFile*,kj::Own<capnp::SchemaParser::ModuleImpl>>>
                     ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<capnp::SchemaFile_const*const,kj::Own<capnp::SchemaParser::ModuleImpl>>,true>>>
                       *)this_00,&local_90);
  local_78._M_node = p_Var9;
  local_60 = file;
  lVar10 = (**(code **)(**(long **)&(p_Var9->
                                    super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
                                    ._M_storage._M_storage + 0x28))();
  p_Var16 = (_Hash_node_base *)(ulong)(lVar10 != 0);
  uVar14 = (ulong)p_Var16 % (this_01->fileMap).value._M_h._M_bucket_count;
  p_Var17 = (this_01->fileMap).value._M_h._M_buckets[uVar14 & 0xffffffff];
  if (p_Var17 != (__node_base_ptr)0x0) {
    p_Var13 = p_Var17->_M_nxt[4]._M_nxt;
    p_Var19 = p_Var17->_M_nxt;
    do {
      if (p_Var13 == p_Var16) {
        plVar3 = *(long **)&(p_Var9->
                            super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
                            ._M_storage._M_storage;
        cVar8 = (**(code **)(*plVar3 + 0x18))(plVar3,p_Var19[1]._M_nxt);
        if (cVar8 != '\0') {
          p_Var20 = (__node_ptr)p_Var17->_M_nxt;
          if (p_Var20 != (__node_ptr)0x0) {
            bVar7 = false;
            goto LAB_0044b82e;
          }
          break;
        }
      }
      p_Var4 = p_Var19->_M_nxt;
      if (p_Var4 == (_Hash_node_base *)0x0) break;
      p_Var13 = p_Var4[4]._M_nxt;
      p_Var17 = p_Var19;
      p_Var19 = p_Var4;
    } while ((ulong)p_Var13 % (this_01->fileMap).value._M_h._M_bucket_count == uVar14);
  }
  local_68 = (this_01->fileMap).value._M_h._M_rehash_policy._M_next_resize;
  auVar21 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                      ((ulong)&(this_01->fileMap).value._M_h._M_rehash_policy,
                       (this_01->fileMap).value._M_h._M_bucket_count,
                       (this_01->fileMap).value._M_h._M_element_count);
  __bkt_count = auVar21._8_8_;
  if ((auVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pp_Var11 = (this_00->_M_h)._M_buckets;
  }
  else {
    if (__bkt_count == 1) {
      pp_Var11 = &(this_01->fileMap).value._M_h._M_single_bucket;
      (this_01->fileMap).value._M_h._M_single_bucket = (__node_base_ptr)0x0;
    }
    else {
      pp_Var11 = std::__detail::
                 _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>_>_>
                 ::_M_allocate_buckets
                           ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>_>_>
                             *)this_00,__bkt_count);
    }
    p_Var1 = &(this_01->fileMap).value._M_h._M_before_begin;
    _Var5._M_nxt = (this_01->fileMap).value._M_h._M_before_begin._M_nxt;
    (this_01->fileMap).value._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    uVar14 = 0;
LAB_0044b76a:
    _Var18._M_nxt = _Var5._M_nxt;
    uVar15 = uVar14;
    if (_Var18._M_nxt != (_Hash_node_base *)0x0) {
      _Var5._M_nxt = (_Var18._M_nxt)->_M_nxt;
      uVar14 = (ulong)_Var18._M_nxt[4]._M_nxt % __bkt_count;
      if (pp_Var11[uVar14] == (__node_base_ptr)0x0) goto LAB_0044b799;
      (_Var18._M_nxt)->_M_nxt = pp_Var11[uVar14]->_M_nxt;
      pp_Var12 = &pp_Var11[uVar14]->_M_nxt;
      uVar14 = uVar15;
      goto LAB_0044b7b0;
    }
    std::
    _Hashtable<const_capnp::SchemaFile_*,_std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_std::allocator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>,_std::__detail::_Select1st,_capnp::(anonymous_namespace)::SchemaFileEq,_capnp::(anonymous_namespace)::SchemaFileHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_deallocate_buckets(&this_00->_M_h);
    (this_01->fileMap).value._M_h._M_bucket_count = __bkt_count;
    (this_01->fileMap).value._M_h._M_buckets = pp_Var11;
    uVar14 = (ulong)p_Var16 % __bkt_count;
  }
  (p_Var9->
  super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
  ).super__Hash_node_code_cache<true>._M_hash_code = (size_t)p_Var16;
  if (pp_Var11[uVar14] == (__node_base_ptr)0x0) {
    (p_Var9->super__Hash_node_base)._M_nxt = (this_01->fileMap).value._M_h._M_before_begin._M_nxt;
    (this_01->fileMap).value._M_h._M_before_begin._M_nxt = &p_Var9->super__Hash_node_base;
    p_Var16 = (p_Var9->super__Hash_node_base)._M_nxt;
    if (p_Var16 != (_Hash_node_base *)0x0) {
      pp_Var11[(ulong)p_Var16[4]._M_nxt % (this_01->fileMap).value._M_h._M_bucket_count] =
           &p_Var9->super__Hash_node_base;
      pp_Var11 = (this_01->fileMap).value._M_h._M_buckets;
    }
    pp_Var11[uVar14] = &(this_01->fileMap).value._M_h._M_before_begin;
  }
  else {
    (p_Var9->super__Hash_node_base)._M_nxt = pp_Var11[uVar14]->_M_nxt;
    pp_Var11[uVar14]->_M_nxt = &p_Var9->super__Hash_node_base;
  }
  psVar2 = &(this_01->fileMap).value._M_h._M_element_count;
  *psVar2 = *psVar2 + 1;
  local_78._M_node = (__node_ptr)0x0;
  bVar7 = true;
  p_Var20 = p_Var9;
LAB_0044b82e:
  std::
  _Hashtable<const_capnp::SchemaFile_*,_std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_std::allocator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>,_std::__detail::_Select1st,_capnp::(anonymous_namespace)::SchemaFileEq,_capnp::(anonymous_namespace)::SchemaFileHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_78);
  kj::Own<capnp::SchemaParser::ModuleImpl>::dispose(&local_90.second);
  kj::Own<capnp::SchemaParser::ModuleImpl>::dispose(&local_40);
  if (bVar7) {
    kj::heap<capnp::SchemaParser::ModuleImpl,capnp::SchemaParser_const&,kj::Own<capnp::SchemaFile>>
              ((kj *)&local_90,local_58,local_60);
    kj::Own<capnp::SchemaParser::ModuleImpl>::operator=
              ((Own<capnp::SchemaParser::ModuleImpl> *)
               ((long)&(p_Var20->
                       super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
                       ._M_storage._M_storage + 8),(Own<capnp::SchemaParser::ModuleImpl> *)&local_90
              );
    kj::Own<capnp::SchemaParser::ModuleImpl>::dispose
              ((Own<capnp::SchemaParser::ModuleImpl> *)&local_90);
  }
  pMVar6 = *(ModuleImpl **)
            ((long)&(p_Var20->
                    super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
                    ._M_storage._M_storage + 0x10);
  kj::
  Locked<std::unordered_map<const_capnp::SchemaFile_*,_kj::Own<capnp::SchemaParser::ModuleImpl>,_capnp::(anonymous_namespace)::SchemaFileHash,_capnp::(anonymous_namespace)::SchemaFileEq,_std::allocator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>_>_>
  ::~Locked(&lock);
  return pMVar6;
LAB_0044b799:
  (_Var18._M_nxt)->_M_nxt = p_Var1->_M_nxt;
  p_Var1->_M_nxt = _Var18._M_nxt;
  pp_Var11[uVar14] = p_Var1;
  if ((_Var18._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pp_Var12 = pp_Var11 + uVar15;
LAB_0044b7b0:
    *pp_Var12 = _Var18._M_nxt;
  }
  goto LAB_0044b76a;
}

Assistant:

SchemaParser::ModuleImpl& SchemaParser::getModuleImpl(kj::Own<SchemaFile>&& file) const {
  auto lock = impl->fileMap.lockExclusive();

  auto insertResult = lock->insert(std::make_pair(file.get(), kj::Own<ModuleImpl>()));
  if (insertResult.second) {
    // This is a newly-inserted entry.  Construct the ModuleImpl.
    insertResult.first->second = kj::heap<ModuleImpl>(*this, kj::mv(file));
  }
  return *insertResult.first->second;
}